

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk50(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk50 *peVar4;
  envy_bios_power_unk50_entry *peVar5;
  envy_bios_power_unk50_entry *e;
  int err;
  int i;
  envy_bios_power_unk50 *unk50;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk50;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk50.version);
    if ((bios->power).unk50.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk50.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk50.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk50.entriesnum);
      (bios->power).unk50.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk50_entry *)malloc((ulong)(bios->power).unk50.entriesnum * 0x14);
      (bios->power).unk50.entries = peVar5;
      for (e._4_4_ = 0; e._4_4_ < (int)(uint)(bios->power).unk50.entriesnum; e._4_4_ = e._4_4_ + 1)
      {
        peVar5 = (bios->power).unk50.entries + e._4_4_;
        peVar5->offset =
             peVar4->offset + (uint)(bios->power).unk50.hlen +
             e._4_4_ * (uint)(bios->power).unk50.rlen;
        bios_u8(bios,peVar5->offset,&peVar5->mode);
        bios_u16(bios,peVar5->offset + 2,&peVar5->t0);
        bios_u16(bios,peVar5->offset + 4,&peVar5->t1);
        bios_u16(bios,peVar5->offset + 6,&peVar5->t2);
        bios_u16(bios,peVar5->offset + 8,&peVar5->interval_us);
        bios_u16(bios,peVar5->offset + 0x12,(uint16_t *)&peVar5->down_off);
        bios_u16(bios,peVar5->offset + 0x14,(uint16_t *)&peVar5->up_off);
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown THERMAL POLICY table version 0x%x\n",
              (ulong)(bios->power).unk50.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk50(struct envy_bios *bios) {
	struct envy_bios_power_unk50 *unk50 = &bios->power.unk50;
	int i, err = 0;

	if (!unk50->offset)
		return -EINVAL;

	bios_u8(bios, unk50->offset + 0x0, &unk50->version);
	switch(unk50->version) {
	case 0x10:
		err |= bios_u8(bios, unk50->offset + 0x1, &unk50->hlen);
		err |= bios_u8(bios, unk50->offset + 0x2, &unk50->rlen);
		err |= bios_u8(bios, unk50->offset + 0x3, &unk50->entriesnum);
		unk50->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERMAL POLICY table version 0x%x\n", unk50->version);
		return -EINVAL;
	};

	err = 0;
	unk50->entries = malloc(unk50->entriesnum * sizeof(struct envy_bios_power_unk50_entry));
	for (i = 0; i < unk50->entriesnum; i++) {
		struct envy_bios_power_unk50_entry *e = &unk50->entries[i];

		e->offset = unk50->offset + unk50->hlen + i * unk50->rlen;
		bios_u8 (bios, e->offset + 0x0, &e->mode);
		bios_u16(bios, e->offset + 0x2, &e->t0);
		bios_u16(bios, e->offset + 0x4, &e->t1);
		bios_u16(bios, e->offset + 0x6, &e->t2);
		bios_u16(bios, e->offset + 0x8, &e->interval_us);

		bios_u16(bios, e->offset + 0x12, &e->down_off);
		bios_u16(bios, e->offset + 0x14, &e->up_off);
	}

	return 0;
}